

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O2

QString * __thiscall
QXcbScreen::getName(QString *__return_storage_ptr__,QXcbScreen *this,
                   xcb_randr_monitor_info_t *monitorInfo)

{
  Data *pDVar1;
  qsizetype qVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QArrayDataPointer<char16_t> local_140;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char> local_e8;
  QByteArrayView local_c8;
  QArrayDataPointer<char> local_b8;
  QStringBuilder<QString,_char16_t> local_98;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  local_b8.size = -0x5555555555555556;
  local_b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_b8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QXcbBasicConnection::atomName
            ((QByteArray *)&local_b8,*(QXcbBasicConnection **)(this + 0x10),monitorInfo->name);
  if (local_b8.size == 0) {
    local_e8.size = -0x5555555555555556;
    local_e8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_e8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    pcVar3 = *(char **)(*(long *)(this + 0x10) + 0x20);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    QByteArray::QByteArray((QByteArray *)&local_e8,pcVar3,-1);
    qVar2 = QByteArray::lastIndexOf((QByteArray *)&local_e8,'.',-1);
    if ((int)qVar2 != -1) {
      QByteArray::truncate((longlong)&local_e8);
    }
    QString::fromLocal8Bit<void>((QString *)&local_128,(QByteArray *)&local_e8);
    local_98.a.d.size = local_128.size;
    local_98.a.d.ptr = local_128.ptr;
    local_98.a.d.d = local_128.d;
    local_128.d = (Data *)0x0;
    local_128.ptr = (char16_t *)0x0;
    local_128.size = 0;
    local_98.b = L'.';
    QString::number((int)&local_140,*(int *)(*(long *)(this + 0x20) + 0x10));
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder
              (&local_78,&local_98,(QString *)&local_140);
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
              ((QString *)&local_108,&local_78);
    pDVar1 = local_108.d;
    local_108.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_108.ptr;
    local_108.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_108.size;
    local_108.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_140);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
  }
  else {
    local_98.a.d.d = (Data *)local_b8.ptr;
    if ((Data *)local_b8.ptr == (Data *)0x0) {
      local_98.a.d.d = (Data *)&QByteArray::_empty;
    }
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_c8,(char **)&local_98);
    QVar4.m_data = (storage_type *)local_c8.m_size;
    QVar4.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar4);
    pDVar1 = local_78.a.a.d.d;
    local_78.a.a.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_78.a.a.d.ptr;
    local_78.a.a.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_78.a.a.d.size;
    local_78.a.a.d.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QXcbScreen::getName(xcb_randr_monitor_info_t *monitorInfo)
{
    QString name;
    QByteArray ba = connection()->atomName(monitorInfo->name);
    if (!ba.isEmpty()) {
        name = QString::fromLatin1(ba.constData());
    } else {
        QByteArray displayName = connection()->displayName();
        int dotPos = displayName.lastIndexOf('.');
        if (dotPos != -1)
            displayName.truncate(dotPos);
        name = QString::fromLocal8Bit(displayName) + u'.'
                + QString::number(m_virtualDesktop->number());
    }
    return name;
}